

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromZeroExtendedInteger
          (IEEEFloat *this,integerPart *parts,uint width,bool isSigned,roundingMode rounding_mode)

{
  int iVar1;
  opStatus oVar2;
  undefined7 in_register_00000009;
  anon_union_8_2_1313ab2f_for_U src;
  uint srcCount;
  ArrayRef<unsigned_long> bigVal;
  APInt api;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  APInt local_50;
  APInt local_40;
  
  srcCount = width + 0x3f >> 6;
  bigVal.Length._0_4_ = srcCount;
  bigVal.Data = parts;
  bigVal.Length._4_4_ = 0;
  APInt::APInt((APInt *)&local_60,width,bigVal);
  this->field_0x12 = this->field_0x12 & 0xf7;
  if ((int)CONCAT71(in_register_00000009,isSigned) != 0) {
    iVar1 = APInt::tcExtractBit(parts,width - 1);
    if (iVar1 != 0) {
      this->field_0x12 = this->field_0x12 | 8;
      APInt::APInt(&local_50,(APInt *)&local_60);
      operator-((llvm *)&local_40,&local_50);
      APInt::operator=((APInt *)&local_60,&local_40);
      APInt::~APInt(&local_40);
      APInt::~APInt(&local_50);
    }
  }
  src.pVal = (uint64_t *)&local_60;
  if (0x40 < local_58) {
    src = local_60;
  }
  oVar2 = convertFromUnsignedParts(this,src.pVal,srcCount,rounding_mode);
  APInt::~APInt((APInt *)&local_60);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromZeroExtendedInteger(const integerPart *parts,
                                          unsigned int width, bool isSigned,
                                          roundingMode rounding_mode) {
  unsigned int partCount = partCountForBits(width);
  APInt api = APInt(width, makeArrayRef(parts, partCount));

  sign = false;
  if (isSigned && APInt::tcExtractBit(parts, width - 1)) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}